

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O3

int __thiscall
QWindowsStyle::styleHint
          (QWindowsStyle *this,StyleHint hint,QStyleOption *opt,QWidget *widget,
          QStyleHintReturn *returnData)

{
  QStyleHintReturn QVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QPalette *pQVar5;
  uint uVar6;
  ColorGroup CVar7;
  long in_FS_OFFSET;
  QRegion local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)hint < 0x1b) {
    if ((int)hint < 0x10) {
      if (hint - SH_PrintDialog_RightAlignButtons < 4) {
LAB_003a383f:
        uVar6 = 1;
      }
      else if (hint == SH_EtchDisabledText) {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (opt == (QStyleOption *)0x0) {
          if (widget != (QWidget *)0x0) {
            pQVar5 = QWidget::palette(widget);
            goto LAB_003a3a59;
          }
          QPalette::QPalette((QPalette *)local_48);
        }
        else {
          pQVar5 = &opt->palette;
LAB_003a3a59:
          QPalette::QPalette((QPalette *)local_48,pQVar5);
        }
        CVar7 = (ColorGroup)(QPalette *)local_48;
        QPalette::brush(CVar7,Dark);
        iVar2 = QColor::lightness();
        QPalette::brush(CVar7,Dark);
        iVar3 = QColor::lightness();
        QPalette::~QPalette((QPalette *)local_48);
        uVar6 = (uint)(iVar3 < iVar2);
      }
      else {
        uVar6 = 1;
        if (hint != SH_Slider_SnapToValue) goto LAB_003a3a10;
      }
    }
    else {
      uVar6 = 1;
      if (4 < hint - SH_MenuBar_AltKeyNavigation) {
        if (hint != SH_Menu_SubMenuPopupDelay) goto LAB_003a3a10;
LAB_003a38a9:
        uVar6 = 400;
      }
    }
  }
  else if ((int)hint < 0x47) {
    if ((int)hint < 0x36) {
      uVar6 = 1;
      if (hint != SH_Slider_StopMouseOverSlider) {
        if (hint == SH_ToolBox_SelectedPageTitleBold) goto LAB_003a38f9;
LAB_003a3a10:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          iVar2 = QCommonStyle::styleHint(&this->super_QCommonStyle,hint,opt,widget,returnData);
          return iVar2;
        }
        goto LAB_003a3ae3;
      }
    }
    else if (hint == SH_RubberBand_Mask) {
      uVar6 = 0;
      if ((((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (uVar6 = 0, opt->type == 0xd)) &&
         (opt[1].version == 1)) {
        if ((returnData == (QStyleHintReturn *)0x0) || (1 < returnData->version)) goto LAB_003a383f;
        uVar6 = 1;
        if (returnData->type == 0xf001) {
          QRegion::QRegion((QRegion *)local_48,&opt->rect,Rectangle);
          QVar1 = returnData[1];
          returnData[1].version = local_48._0_4_;
          returnData[1].type = local_48._4_4_;
          local_48._0_8_ = QVar1;
          QRegion::~QRegion((QRegion *)local_48);
          uVar6 = 1;
          iVar2 = 1;
          if (widget != (QWidget *)0x0) {
            iVar2 = ((byte)(widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
                           .super_QFlagsStorage<Qt::WindowType>.i & 1) * 3 + 1;
          }
          local_48._0_4_ = (opt->rect).x1.m_i + iVar2;
          local_48._4_4_ = (opt->rect).y1.m_i + iVar2;
          local_48._8_8_ = CONCAT44((opt->rect).y2.m_i - iVar2,(opt->rect).x2.m_i - iVar2);
          QRegion::QRegion(&local_50,(QRect *)local_48,Rectangle);
          QRegion::operator-=((QRegion *)(returnData + 1),&local_50);
          QRegion::~QRegion(&local_50);
        }
      }
    }
    else {
      if (hint != SH_ItemView_ShowDecorationSelected) goto LAB_003a3a10;
      lVar4 = QMetaObject::cast((QObject *)&QListView::staticMetaObject);
      uVar6 = (uint)(lVar4 != 0);
    }
  }
  else {
    uVar6 = 1;
    if (1 < hint - SH_WizardStyle) {
      if (hint != SH_DialogButtonBox_ButtonsHaveIcons) {
        if (hint == SH_Menu_SubMenuSloppyCloseTimeout) goto LAB_003a38a9;
        goto LAB_003a3a10;
      }
LAB_003a38f9:
      uVar6 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar6;
  }
LAB_003a3ae3:
  __stack_chk_fail();
}

Assistant:

int QWindowsStyle::styleHint(StyleHint hint, const QStyleOption *opt, const QWidget *widget,
                             QStyleHintReturn *returnData) const
{
    int ret = 0;

    switch (hint) {
    case SH_EtchDisabledText: {
        const QPalette pal = opt ? opt->palette
                                 : widget ? widget->palette()
                                          : QPalette();
        ret = pal.window().color().lightness() > pal.text().color().lightness()
            ? 1 : 0;
        break;
    }
    case SH_Slider_SnapToValue:
    case SH_PrintDialog_RightAlignButtons:
    case SH_FontDialog_SelectAssociatedText:
    case SH_Menu_AllowActiveAndDisabled:
    case SH_MenuBar_AltKeyNavigation:
    case SH_MenuBar_MouseTracking:
    case SH_Menu_MouseTracking:
    case SH_ComboBox_ListMouseTracking:
    case SH_Slider_StopMouseOverSlider:
    case SH_MainWindow_SpaceBelowMenuBar:
        ret = 1;

        break;
    case SH_ItemView_ShowDecorationSelected:
#if QT_CONFIG(listview)
        if (qobject_cast<const QListView*>(widget))
            ret = 1;
#endif
        break;
    case SH_ItemView_ChangeHighlightOnFocus:
        ret = 1;
        break;
    case SH_ToolBox_SelectedPageTitleBold:
        ret = 0;
        break;

#if defined(Q_OS_WIN)
    case SH_UnderlineShortcut:
    {
        ret = 1;
        BOOL cues = false;
        SystemParametersInfo(SPI_GETKEYBOARDCUES, 0, &cues, 0);
        ret = int(cues);
        // Do nothing if we always paint underlines
        Q_D(const QWindowsStyle);
        if (!ret && widget && d) {
#if QT_CONFIG(menubar)
            const QMenuBar *menuBar = qobject_cast<const QMenuBar *>(widget);
            if (!menuBar && qobject_cast<const QMenu *>(widget)) {
                QWidget *w = QApplication::activeWindow();
                if (w && w != widget)
                    menuBar = w->findChild<QMenuBar *>();
            }
            // If we paint a menu bar draw underlines if is in the keyboardState
            if (menuBar) {
                if (menuBar->d_func()->keyboardState || d->altDown())
                    ret = 1;
                // Otherwise draw underlines if the toplevel widget has seen an alt-press
            } else
#endif // QT_CONFIG(menubar)
            if (d->hasSeenAlt(widget)) {
                ret = 1;
            }
        }
#if QT_CONFIG(accessibility)
        if (!ret && opt && opt->type == QStyleOption::SO_MenuItem
            && QStyleHelper::isInstanceOf(opt->styleObject, QAccessible::MenuItem)
            && opt->styleObject->property("_q_showUnderlined").toBool())
            ret = 1;
#endif // QT_CONFIG(accessibility)
        break;
    }
#endif // Q_OS_WIN
    case SH_Menu_SubMenuSloppyCloseTimeout:
    case SH_Menu_SubMenuPopupDelay: {
#if defined(Q_OS_WIN)
        DWORD delay;
        if (SystemParametersInfo(SPI_GETMENUSHOWDELAY, 0, &delay, 0))
            ret = delay;
        else
#endif // Q_OS_WIN
            ret = 400;
        break;
    }
#if QT_CONFIG(rubberband)
    case SH_RubberBand_Mask:
        if (const QStyleOptionRubberBand *rbOpt = qstyleoption_cast<const QStyleOptionRubberBand *>(opt)) {
            ret = 0;
            if (rbOpt->shape == QRubberBand::Rectangle) {
                ret = true;
                if (QStyleHintReturnMask *mask = qstyleoption_cast<QStyleHintReturnMask*>(returnData)) {
                    mask->region = opt->rect;
                    int size = 1;
                    if (widget && widget->isWindow())
                        size = 4;
                    mask->region -= opt->rect.adjusted(size, size, -size, -size);
                }
            }
        }
        break;
#endif // QT_CONFIG(rubberband)
#if QT_CONFIG(wizard)
    case SH_WizardStyle:
        ret = QWizard::ModernStyle;
        break;
#endif
    case SH_ItemView_ArrowKeysNavigateIntoChildren:
        ret = true;
        break;
    case SH_DialogButtonBox_ButtonsHaveIcons:
        ret = 0;
        break;
    default:
        ret = QCommonStyle::styleHint(hint, opt, widget, returnData);
        break;
    }
    return ret;
}